

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall SimpleASTNode::print(SimpleASTNode *this,int level)

{
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  _List_node_base *p_Var4;
  string local_58 [39];
  allocator local_31;
  
  if (level == 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  iVar3 = 0;
  if (0 < level) {
    iVar3 = level;
  }
  while (iVar3 != 0) {
    std::operator<<((ostream *)&std::cout,'\t');
    iVar3 = iVar3 + -1;
  }
  switch(this->m_type) {
  case DECLARATION:
    pcVar2 = "Key Word";
    break;
  case INT_LITERAL:
    pcVar2 = "Int Literal";
    break;
  case ID:
    pcVar2 = "Variable ID";
    break;
  case ASSIGMENT:
    pcVar2 = "Assignment";
    break;
  case ADDITIVE_EXP:
    pcVar2 = "Additive";
    break;
  case MULTIL_EXP:
    pcVar2 = "Multiplicative";
    break;
  default:
    pcVar2 = "Default";
  }
  std::__cxx11::string::string(local_58,pcVar2,&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,local_58);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_text);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_58);
  p_Var4 = (_List_node_base *)&this->m_childList;
  while (p_Var4 = (((_List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->m_childList) {
    print((SimpleASTNode *)p_Var4[1]._M_next,level + 1);
  }
  return;
}

Assistant:

void SimpleASTNode::print(int level)
{
    if (!level)
        std::cout << std::endl;
    for (int i = 0; i < level; i++)
        std::cout << '\t';
    std::cout << syntaxType(m_type) << " : " << m_text << std::endl;
    for (auto& item : m_childList) {
        item->print(level + 1);
    }
}